

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecSetup(N_Vector uu,N_Vector uscale,N_Vector fval,N_Vector fscale,void *bbd_data)

{
  KINMem kin_mem_00;
  int iVar1;
  SUNLinearSolver in_RCX;
  SUNMatrix in_R8;
  int retval;
  KINMem kin_mem;
  KBBDPrecData pdata;
  N_Vector in_stack_00000070;
  N_Vector in_stack_00000078;
  N_Vector in_stack_00000080;
  N_Vector in_stack_00000088;
  N_Vector in_stack_00000090;
  KBBDPrecData in_stack_00000098;
  int local_4;
  
  kin_mem_00 = (KINMem)in_R8[6].content;
  iVar1 = SUNMatZero(in_R8[2].sunctx);
  if (iVar1 == 0) {
    iVar1 = KBBDDQJac(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                      in_stack_00000078,in_stack_00000070);
    if (iVar1 == 0) {
      local_4 = SUNLinSolSetup_Band(in_RCX,in_R8);
    }
    else {
      KINProcessError(kin_mem_00,-1,0x1ab,"KINBBDPrecSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                      ,"The gloc or gcomm routine failed in an unrecoverable manner.");
      local_4 = -1;
    }
  }
  else {
    KINProcessError(kin_mem_00,-1,0x1a2,"KINBBDPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"An error arose from a SUNBandMatrix routine.");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int KINBBDPrecSetup(N_Vector uu, N_Vector uscale,
                           SUNDIALS_MAYBE_UNUSED N_Vector fval,
                           SUNDIALS_MAYBE_UNUSED N_Vector fscale, void* bbd_data)
{
  KBBDPrecData pdata;
  KINMem kin_mem;
  int retval;

  pdata = (KBBDPrecData)bbd_data;

  kin_mem = (KINMem)pdata->kin_mem;

  /* Call KBBDDQJac for a new Jacobian calculation and store in PP */
  retval = SUNMatZero(pdata->PP);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  retval = KBBDDQJac(pdata, uu, uscale, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }

  /* Do LU factorization of P and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}